

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obu.c
# Opt level: O0

void alloc_tile_list_buffer(AV1Decoder *pbi,int tile_width_in_pixels,int tile_height_in_pixels)

{
  int iVar1;
  int ss_y;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int in_stack_00000010;
  int in_stack_00000018;
  int in_stack_00000028;
  int output_frame_height;
  int output_frame_width;
  AV1_COMMON *cm;
  _Bool in_stack_ffffffffffffffcb;
  uint3 in_stack_ffffffffffffffdc;
  uint width;
  
  iVar1 = (*(int *)(in_RDI + 0x58de0) + 1) * in_ESI;
  ss_y = (*(int *)(in_RDI + 0x58de4) + 1) * in_EDX;
  width = (uint)in_stack_ffffffffffffffdc;
  if (*(char *)(*(long *)(in_RDI + 0x9be8) + 0x4c) != '\0') {
    width = CONCAT13(8 < *(uint *)(*(long *)(in_RDI + 0x9be8) + 0x48),in_stack_ffffffffffffffdc);
  }
  iVar1 = aom_alloc_frame_buffer
                    ((YV12_BUFFER_CONFIG *)CONCAT44(iVar1,ss_y),width,
                     *(int *)(*(long *)(in_RDI + 0x9be8) + 100),
                     *(int *)(*(long *)(in_RDI + 0x9be8) + 0x60),ss_y,iVar1,in_stack_00000010,
                     in_stack_00000018,in_stack_ffffffffffffffcb,in_stack_00000028);
  if (iVar1 != 0) {
    aom_internal_error((aom_internal_error_info *)(in_RDI + 0x5ff08),AOM_CODEC_MEM_ERROR,
                       "Failed to allocate the tile list output buffer");
  }
  return;
}

Assistant:

static void alloc_tile_list_buffer(AV1Decoder *pbi, int tile_width_in_pixels,
                                   int tile_height_in_pixels) {
  // The resolution of the output frame is read out from the bitstream. The data
  // are stored in the order of Y plane, U plane and V plane. As an example, for
  // image format 4:2:0, the output frame of U plane and V plane is 1/4 of the
  // output frame.
  AV1_COMMON *const cm = &pbi->common;
  const int output_frame_width =
      (pbi->output_frame_width_in_tiles_minus_1 + 1) * tile_width_in_pixels;
  const int output_frame_height =
      (pbi->output_frame_height_in_tiles_minus_1 + 1) * tile_height_in_pixels;
  // The output frame is used to store the decoded tile list. The decoded tile
  // list has to fit into 1 output frame.
  assert((pbi->tile_count_minus_1 + 1) <=
         (pbi->output_frame_width_in_tiles_minus_1 + 1) *
             (pbi->output_frame_height_in_tiles_minus_1 + 1));

  // Allocate the tile list output buffer.
  // Note: if cm->seq_params->use_highbitdepth is 1 and
  // cm->seq_params->bit_depth is 8, we could allocate less memory, namely, 8
  // bits/pixel.
  if (aom_alloc_frame_buffer(&pbi->tile_list_outbuf, output_frame_width,
                             output_frame_height, cm->seq_params->subsampling_x,
                             cm->seq_params->subsampling_y,
                             (cm->seq_params->use_highbitdepth &&
                              (cm->seq_params->bit_depth > AOM_BITS_8)),
                             0, cm->features.byte_alignment, false, 0))
    aom_internal_error(&pbi->error, AOM_CODEC_MEM_ERROR,
                       "Failed to allocate the tile list output buffer");
}